

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chainparamsbase.cpp
# Opt level: O2

void SetupChainParamsBaseOptions(ArgsManager *argsman)

{
  long in_FS_OFFSET;
  OptionsCategory local_58;
  allocator<char> local_52;
  allocator<char> local_51;
  string local_50;
  string local_30;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"-chain=<chain>",&local_51)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,
             "Use the chain <chain> (default: main). Allowed values: main, test, testnet4, signet, regtest"
             ,&local_52);
  local_58 = CHAINPARAMS;
  ArgsManager::AddArg(argsman,&local_30,&local_50,1,&local_58);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"-regtest",&local_51);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,
             "Enter regression test mode, which uses a special chain in which blocks can be solved instantly. This is intended for regression testing tools and app development. Equivalent to -chain=regtest."
             ,&local_52);
  local_58 = CHAINPARAMS;
  ArgsManager::AddArg(argsman,&local_30,&local_50,0x101,&local_58);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"-testactivationheight=name@height.",&local_51);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,
             "Set the activation height of \'name\' (segwit, bip34, dersig, cltv, csv). (regtest-only)"
             ,&local_52);
  local_58 = DEBUG_TEST;
  ArgsManager::AddArg(argsman,&local_30,&local_50,0x101,&local_58);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"-testnet",&local_51);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,
             "Use the testnet3 chain. Equivalent to -chain=test. Support for testnet3 is deprecated and will be removed in an upcoming release. Consider moving to testnet4 now by using -testnet4."
             ,&local_52);
  local_58 = CHAINPARAMS;
  ArgsManager::AddArg(argsman,&local_30,&local_50,1,&local_58);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"-testnet4",&local_51);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"Use the testnet4 chain. Equivalent to -chain=testnet4.",&local_52)
  ;
  local_58 = CHAINPARAMS;
  ArgsManager::AddArg(argsman,&local_30,&local_50,1,&local_58);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"-vbparams=deployment:start:end[:min_activation_height]",&local_51)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,
             "Use given start/end times and min_activation_height for specified version bits deployment (regtest-only)"
             ,&local_52);
  local_58 = CHAINPARAMS;
  ArgsManager::AddArg(argsman,&local_30,&local_50,0x101,&local_58);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"-signet",&local_51);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,
             "Use the signet chain. Equivalent to -chain=signet. Note that the network is defined by the -signetchallenge parameter"
             ,&local_52);
  local_58 = CHAINPARAMS;
  ArgsManager::AddArg(argsman,&local_30,&local_50,1,&local_58);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"-signetchallenge",&local_51);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,
             "Blocks must satisfy the given script to be considered valid (only for signet networks; defaults to the global default signet test network challenge)"
             ,&local_52);
  local_58 = CHAINPARAMS;
  ArgsManager::AddArg(argsman,&local_30,&local_50,0x21,&local_58);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"-signetseednode",&local_51);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,
             "Specify a seed node for the signet network, in the hostname[:port] format, e.g. sig.net:1234 (may be used multiple times to specify multiple seed nodes; defaults to the global default signet test network seed node(s))"
             ,&local_52);
  local_58 = CHAINPARAMS;
  ArgsManager::AddArg(argsman,&local_30,&local_50,0x21,&local_58);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SetupChainParamsBaseOptions(ArgsManager& argsman)
{
    argsman.AddArg("-chain=<chain>", "Use the chain <chain> (default: main). Allowed values: " LIST_CHAIN_NAMES, ArgsManager::ALLOW_ANY, OptionsCategory::CHAINPARAMS);
    argsman.AddArg("-regtest", "Enter regression test mode, which uses a special chain in which blocks can be solved instantly. "
                 "This is intended for regression testing tools and app development. Equivalent to -chain=regtest.", ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::CHAINPARAMS);
    argsman.AddArg("-testactivationheight=name@height.", "Set the activation height of 'name' (segwit, bip34, dersig, cltv, csv). (regtest-only)", ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::DEBUG_TEST);
    argsman.AddArg("-testnet", "Use the testnet3 chain. Equivalent to -chain=test. Support for testnet3 is deprecated and will be removed in an upcoming release. Consider moving to testnet4 now by using -testnet4.", ArgsManager::ALLOW_ANY, OptionsCategory::CHAINPARAMS);
    argsman.AddArg("-testnet4", "Use the testnet4 chain. Equivalent to -chain=testnet4.", ArgsManager::ALLOW_ANY, OptionsCategory::CHAINPARAMS);
    argsman.AddArg("-vbparams=deployment:start:end[:min_activation_height]", "Use given start/end times and min_activation_height for specified version bits deployment (regtest-only)", ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::CHAINPARAMS);
    argsman.AddArg("-signet", "Use the signet chain. Equivalent to -chain=signet. Note that the network is defined by the -signetchallenge parameter", ArgsManager::ALLOW_ANY, OptionsCategory::CHAINPARAMS);
    argsman.AddArg("-signetchallenge", "Blocks must satisfy the given script to be considered valid (only for signet networks; defaults to the global default signet test network challenge)", ArgsManager::ALLOW_ANY | ArgsManager::DISALLOW_NEGATION, OptionsCategory::CHAINPARAMS);
    argsman.AddArg("-signetseednode", "Specify a seed node for the signet network, in the hostname[:port] format, e.g. sig.net:1234 (may be used multiple times to specify multiple seed nodes; defaults to the global default signet test network seed node(s))", ArgsManager::ALLOW_ANY | ArgsManager::DISALLOW_NEGATION, OptionsCategory::CHAINPARAMS);
}